

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,FILE *fp)

{
  int iVar1;
  undefined8 in_RAX;
  size_t __n;
  anon_union_4_2_947300a4_for_anon_struct_72_3_9ed89b7b_1 *__ptr;
  Mat *this_00;
  int id;
  int len;
  undefined8 local_38;
  
  local_38._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  clear(this);
  local_38 = (ulong)local_38._4_4_ << 0x20;
  fread(&local_38,4,1,(FILE *)fp);
  if ((int)local_38 != -0xe9) {
    do {
      if ((int)local_38 < -0x5b03) {
        iVar1 = -(int)local_38;
        local_38 = (ulong)(iVar1 - 0x5b04U);
        fread((void *)((long)&local_38 + 4),4,1,(FILE *)fp);
        this_00 = &this->params[(int)(iVar1 - 0x5b04U)].v;
        iVar1 = local_38._4_4_;
        Mat::create(this_00,local_38._4_4_,4,(Allocator *)0x0);
        __ptr = (anon_union_4_2_947300a4_for_anon_struct_72_3_9ed89b7b_1 *)this_00->data;
        __n = (size_t)iVar1;
      }
      else {
        __ptr = &this->params[(int)local_38].field_1;
        __n = 1;
      }
      fread(__ptr,4,__n,(FILE *)fp);
      this->params[(int)local_38].loaded = 1;
      fread(&local_38,4,1,(FILE *)fp);
    } while ((int)local_38 != -0xe9);
  }
  return 0;
}

Assistant:

int ParamDict::load_param_bin(FILE* fp)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    fread(&id, sizeof(int), 1, fp);

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            fread(&len, sizeof(int), 1, fp);

            params[id].v.create(len);

            float* ptr = params[id].v;
            fread(ptr, sizeof(float), len, fp);
        }
        else
        {
            fread(&params[id].f, sizeof(float), 1, fp);
        }

        params[id].loaded = 1;

        fread(&id, sizeof(int), 1, fp);
    }

    return 0;
}